

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteMaterials(ColladaExporter *this)

{
  undefined8 uVar1;
  __type _Var2;
  bool bVar3;
  aiReturn aVar4;
  char *pcVar5;
  reference pvVar6;
  ulong uVar7;
  ostream *poVar8;
  Surface *pSVar9;
  Property *pPVar10;
  string local_ad8;
  string local_ab8;
  string local_a98;
  reference local_a78;
  Material *mat_3;
  __normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_a68;
  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_a60;
  const_iterator it_2;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  allocator<char> local_999;
  string local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  allocator<char> local_8e1;
  string local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  allocator<char> local_899;
  string local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  allocator<char> local_851;
  string local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  reference local_690;
  Material *mat_2;
  __normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_680;
  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_678;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  reference local_590;
  Material *mat_1;
  __normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_580;
  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
  local_578;
  const_iterator it;
  undefined1 local_568 [4];
  aiShadingMode shading;
  allocator<char> local_541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  aiMaterial *local_500;
  size_t i;
  size_t materialCountWithThisName;
  undefined1 local_4e8 [8];
  string testName;
  allocator<char> local_491;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 local_42c [8];
  aiString name;
  aiMaterial *mat;
  size_t a;
  size_t numTextures;
  ColladaExporter *this_local;
  
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::resize(&this->materials,(ulong)this->mScene->mNumMaterials);
  a = 0;
  for (mat = (aiMaterial *)0x0; mat < (aiMaterial *)(ulong)this->mScene->mNumMaterials;
      mat = (aiMaterial *)((long)&mat->mProperties + 1)) {
    name.data._1016_8_ = this->mScene->mMaterials[(long)mat];
    aiString::aiString((aiString *)local_42c);
    aVar4 = aiMaterial::Get((aiMaterial *)name.data._1016_8_,"?mat.name",0,0,(aiString *)local_42c);
    if (aVar4 == aiReturn_SUCCESS) {
      pcVar5 = aiString::C_Str((aiString *)local_42c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4e8,pcVar5,
                 (allocator<char> *)((long)&materialCountWithThisName + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&materialCountWithThisName + 7));
      i = 0;
      for (local_500 = (aiMaterial *)0x0; local_500 < mat;
          local_500 = (aiMaterial *)((long)&local_500->mProperties + 1)) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)local_500);
        _Var2 = std::operator==(&pvVar6->name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4e8);
        if (_Var2) {
          i = i + 1;
        }
      }
      if (i == 0) {
        pcVar5 = aiString::C_Str((aiString *)local_42c);
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)pvVar6,pcVar5);
      }
      else {
        pcVar5 = aiString::C_Str((aiString *)local_42c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,pcVar5,&local_541);
        to_string<unsigned_long>((string *)local_568,i);
        std::operator+(&local_520,&local_540,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_568);
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)pvVar6,(string *)&local_520);
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::string::~string((string *)local_568);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator(&local_541);
      }
      std::__cxx11::string::~string((string *)local_4e8);
    }
    else {
      aiString::operator=((aiString *)local_42c,"mat");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"m",&local_491);
      to_string<unsigned_long>((string *)((long)&testName.field_2 + 8),(unsigned_long)mat);
      std::operator+(&local_470,&local_490,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&testName.field_2 + 8));
      pcVar5 = aiString::C_Str((aiString *)local_42c);
      std::operator+(&local_450,&local_470,pcVar5);
      pvVar6 = std::
               vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
               ::operator[](&this->materials,(size_type)mat);
      std::__cxx11::string::operator=((string *)pvVar6,(string *)&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)(testName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator(&local_491);
    }
    it._M_current._4_4_ = 1;
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"phong");
    aVar4 = aiMaterial::Get<aiShadingMode>
                      ((aiMaterial *)name.data._1016_8_,"$mat.shadingm",0,0,
                       (aiShadingMode *)((long)&it._M_current + 4));
    if (aVar4 == aiReturn_SUCCESS) {
      if (it._M_current._4_4_ == 3) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"phong");
      }
      else if (it._M_current._4_4_ == 4) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"blinn");
      }
      else if (it._M_current._4_4_ == 9) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"constant");
      }
      else if (it._M_current._4_4_ == 2) {
        pvVar6 = std::
                 vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
                 ::operator[](&this->materials,(size_type)mat);
        std::__cxx11::string::operator=((string *)&pvVar6->shading_model,"lambert");
      }
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->ambient,(aiMaterial *)name.data._1016_8_,aiTextureType_AMBIENT
                        ,"$clr.ambient",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->diffuse,(aiMaterial *)name.data._1016_8_,aiTextureType_DIFFUSE
                        ,"$clr.diffuse",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->specular,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_SPECULAR,"$clr.specular",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->emissive,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_EMISSIVE,"$clr.emissive",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->reflective,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_REFLECTION,"$clr.reflective",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->transparent,(aiMaterial *)name.data._1016_8_,
                        aiTextureType_OPACITY,"$clr.transparent",0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    ReadMaterialSurface(this,&pvVar6->normal,(aiMaterial *)name.data._1016_8_,aiTextureType_NORMALS,
                        (char *)0x0,0,0);
    std::
    vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>::
    operator[](&this->materials,(size_type)mat);
    uVar7 = std::__cxx11::string::empty();
    uVar1 = name.data._1016_8_;
    if ((uVar7 & 1) == 0) {
      a = a + 1;
    }
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    aVar4 = aiMaterial::Get((aiMaterial *)uVar1,"$mat.shininess",0,0,&(pvVar6->shininess).value);
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    uVar1 = name.data._1016_8_;
    (pvVar6->shininess).exist = aVar4 == aiReturn_SUCCESS;
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    aVar4 = aiMaterial::Get((aiMaterial *)uVar1,"$mat.opacity",0,0,&(pvVar6->transparency).value);
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    uVar1 = name.data._1016_8_;
    (pvVar6->transparency).exist = aVar4 == aiReturn_SUCCESS;
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    aVar4 = aiMaterial::Get((aiMaterial *)uVar1,"$mat.refracti",0,0,
                            &(pvVar6->index_refraction).value);
    pvVar6 = std::
             vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
             ::operator[](&this->materials,(size_type)mat);
    (pvVar6->index_refraction).exist = aVar4 == aiReturn_SUCCESS;
  }
  if (a != 0) {
    poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar8 = std::operator<<(poVar8,"<library_images>");
    std::operator<<(poVar8,(string *)&this->endstr);
    PushTag(this);
    local_580._M_current =
         (Material *)
         std::
         vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
         ::begin(&this->materials);
    __gnu_cxx::
    __normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
    ::__normal_iterator<Assimp::ColladaExporter::Material*>
              ((__normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
                *)&local_578,&local_580);
    while( true ) {
      mat_1 = (Material *)
              std::
              vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ::end(&this->materials);
      bVar3 = __gnu_cxx::operator!=
                        (&local_578,
                         (__normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                          *)&mat_1);
      if (!bVar3) break;
      local_590 = __gnu_cxx::
                  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                  ::operator*(&local_578);
      pSVar9 = &local_590->ambient;
      std::operator+(&local_5b0,&local_590->name,"-ambient-image");
      WriteImageEntry(this,pSVar9,&local_5b0);
      std::__cxx11::string::~string((string *)&local_5b0);
      pSVar9 = &local_590->diffuse;
      std::operator+(&local_5d0,&local_590->name,"-diffuse-image");
      WriteImageEntry(this,pSVar9,&local_5d0);
      std::__cxx11::string::~string((string *)&local_5d0);
      pSVar9 = &local_590->specular;
      std::operator+(&local_5f0,&local_590->name,"-specular-image");
      WriteImageEntry(this,pSVar9,&local_5f0);
      std::__cxx11::string::~string((string *)&local_5f0);
      pSVar9 = &local_590->emissive;
      std::operator+(&local_610,&local_590->name,"-emission-image");
      WriteImageEntry(this,pSVar9,&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      pSVar9 = &local_590->reflective;
      std::operator+(&local_630,&local_590->name,"-reflective-image");
      WriteImageEntry(this,pSVar9,&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      pSVar9 = &local_590->transparent;
      std::operator+(&local_650,&local_590->name,"-transparent-image");
      WriteImageEntry(this,pSVar9,&local_650);
      std::__cxx11::string::~string((string *)&local_650);
      pSVar9 = &local_590->normal;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1,
                     &local_590->name,"-normal-image");
      WriteImageEntry(this,pSVar9,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_1);
      std::__cxx11::string::~string((string *)&it_1);
      __gnu_cxx::
      __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
      ::operator++(&local_578);
    }
    PopTag(this);
    poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar8 = std::operator<<(poVar8,"</library_images>");
    std::operator<<(poVar8,(string *)&this->endstr);
  }
  bVar3 = std::
          vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
          ::empty(&this->materials);
  if (!bVar3) {
    poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar8 = std::operator<<(poVar8,"<library_effects>");
    std::operator<<(poVar8,(string *)&this->endstr);
    PushTag(this);
    local_680._M_current =
         (Material *)
         std::
         vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
         ::begin(&this->materials);
    __gnu_cxx::
    __normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
    ::__normal_iterator<Assimp::ColladaExporter::Material*>
              ((__normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
                *)&local_678,&local_680);
    while( true ) {
      mat_2 = (Material *)
              std::
              vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ::end(&this->materials);
      bVar3 = __gnu_cxx::operator!=
                        (&local_678,
                         (__normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                          *)&mat_2);
      if (!bVar3) break;
      local_690 = __gnu_cxx::
                  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                  ::operator*(&local_678);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"<effect id=\"");
      XMLIDEncode(&local_6b0,&local_690->name);
      poVar8 = std::operator<<(poVar8,(string *)&local_6b0);
      poVar8 = std::operator<<(poVar8,"-fx\" name=\"");
      XMLEscape(&local_6d0,&local_690->name);
      poVar8 = std::operator<<(poVar8,(string *)&local_6d0);
      poVar8 = std::operator<<(poVar8,"\">");
      std::operator<<(poVar8,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::__cxx11::string::~string((string *)&local_6b0);
      PushTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"<profile_COMMON>");
      std::operator<<(poVar8,(string *)&this->endstr);
      PushTag(this);
      pSVar9 = &local_690->emissive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"emission",&local_6f1)
      ;
      WriteTextureParamEntry(this,pSVar9,&local_6f0,&local_690->name);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::allocator<char>::~allocator(&local_6f1);
      pSVar9 = &local_690->ambient;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_718,"ambient",&local_719);
      WriteTextureParamEntry(this,pSVar9,&local_718,&local_690->name);
      std::__cxx11::string::~string((string *)&local_718);
      std::allocator<char>::~allocator(&local_719);
      pSVar9 = &local_690->diffuse;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"diffuse",&local_741);
      WriteTextureParamEntry(this,pSVar9,&local_740,&local_690->name);
      std::__cxx11::string::~string((string *)&local_740);
      std::allocator<char>::~allocator(&local_741);
      pSVar9 = &local_690->specular;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"specular",&local_769)
      ;
      WriteTextureParamEntry(this,pSVar9,&local_768,&local_690->name);
      std::__cxx11::string::~string((string *)&local_768);
      std::allocator<char>::~allocator(&local_769);
      pSVar9 = &local_690->reflective;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_790,"reflective",&local_791);
      WriteTextureParamEntry(this,pSVar9,&local_790,&local_690->name);
      std::__cxx11::string::~string((string *)&local_790);
      std::allocator<char>::~allocator(&local_791);
      pSVar9 = &local_690->transparent;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b8,"transparent",&local_7b9);
      WriteTextureParamEntry(this,pSVar9,&local_7b8,&local_690->name);
      std::__cxx11::string::~string((string *)&local_7b8);
      std::allocator<char>::~allocator(&local_7b9);
      pSVar9 = &local_690->normal;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"normal",&local_7e1);
      WriteTextureParamEntry(this,pSVar9,&local_7e0,&local_690->name);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::allocator<char>::~allocator(&local_7e1);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"<technique sid=\"standard\">");
      std::operator<<(poVar8,(string *)&this->endstr);
      PushTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"<");
      poVar8 = std::operator<<(poVar8,(string *)&local_690->shading_model);
      poVar8 = std::operator<<(poVar8,">");
      std::operator<<(poVar8,(string *)&this->endstr);
      PushTag(this);
      pSVar9 = &local_690->emissive;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"emission",&local_809)
      ;
      std::operator+(&local_830,&local_690->name,"-emission-sampler");
      WriteTextureColorEntry(this,pSVar9,&local_808,&local_830);
      std::__cxx11::string::~string((string *)&local_830);
      std::__cxx11::string::~string((string *)&local_808);
      std::allocator<char>::~allocator(&local_809);
      pSVar9 = &local_690->ambient;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,"ambient",&local_851);
      std::operator+(&local_878,&local_690->name,"-ambient-sampler");
      WriteTextureColorEntry(this,pSVar9,&local_850,&local_878);
      std::__cxx11::string::~string((string *)&local_878);
      std::__cxx11::string::~string((string *)&local_850);
      std::allocator<char>::~allocator(&local_851);
      pSVar9 = &local_690->diffuse;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_898,"diffuse",&local_899);
      std::operator+(&local_8c0,&local_690->name,"-diffuse-sampler");
      WriteTextureColorEntry(this,pSVar9,&local_898,&local_8c0);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_898);
      std::allocator<char>::~allocator(&local_899);
      pSVar9 = &local_690->specular;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"specular",&local_8e1)
      ;
      std::operator+(&local_908,&local_690->name,"-specular-sampler");
      WriteTextureColorEntry(this,pSVar9,&local_8e0,&local_908);
      std::__cxx11::string::~string((string *)&local_908);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::allocator<char>::~allocator(&local_8e1);
      pPVar10 = &local_690->shininess;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_928,"shininess",&local_929);
      WriteFloatEntry(this,pPVar10,&local_928);
      std::__cxx11::string::~string((string *)&local_928);
      std::allocator<char>::~allocator(&local_929);
      pSVar9 = &local_690->reflective;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_950,"reflective",&local_951);
      std::operator+(&local_978,&local_690->name,"-reflective-sampler");
      WriteTextureColorEntry(this,pSVar9,&local_950,&local_978);
      std::__cxx11::string::~string((string *)&local_978);
      std::__cxx11::string::~string((string *)&local_950);
      std::allocator<char>::~allocator(&local_951);
      pSVar9 = &local_690->transparent;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_998,"transparent",&local_999);
      std::operator+(&local_9c0,&local_690->name,"-transparent-sampler");
      WriteTextureColorEntry(this,pSVar9,&local_998,&local_9c0);
      std::__cxx11::string::~string((string *)&local_9c0);
      std::__cxx11::string::~string((string *)&local_998);
      std::allocator<char>::~allocator(&local_999);
      pPVar10 = &local_690->transparency;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9e0,"transparency",&local_9e1);
      WriteFloatEntry(this,pPVar10,&local_9e0);
      std::__cxx11::string::~string((string *)&local_9e0);
      std::allocator<char>::~allocator(&local_9e1);
      pPVar10 = &local_690->index_refraction;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a08,"index_of_refraction",&local_a09);
      WriteFloatEntry(this,pPVar10,&local_a08);
      std::__cxx11::string::~string((string *)&local_a08);
      std::allocator<char>::~allocator(&local_a09);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pSVar9 = &local_690->normal;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"bump",&local_a31);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                       &local_690->name,"-normal-sampler");
        WriteTextureColorEntry(this,pSVar9,&local_a30,(string *)&it_2);
        std::__cxx11::string::~string((string *)&it_2);
        std::__cxx11::string::~string((string *)&local_a30);
        std::allocator<char>::~allocator(&local_a31);
      }
      PopTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"</");
      poVar8 = std::operator<<(poVar8,(string *)&local_690->shading_model);
      poVar8 = std::operator<<(poVar8,">");
      std::operator<<(poVar8,(string *)&this->endstr);
      PopTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"</technique>");
      std::operator<<(poVar8,(string *)&this->endstr);
      PopTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"</profile_COMMON>");
      std::operator<<(poVar8,(string *)&this->endstr);
      PopTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"</effect>");
      std::operator<<(poVar8,(string *)&this->endstr);
      __gnu_cxx::
      __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
      ::operator++(&local_678);
    }
    PopTag(this);
    poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar8 = std::operator<<(poVar8,"</library_effects>");
    std::operator<<(poVar8,(string *)&this->endstr);
    poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar8 = std::operator<<(poVar8,"<library_materials>");
    std::operator<<(poVar8,(string *)&this->endstr);
    PushTag(this);
    local_a68._M_current =
         (Material *)
         std::
         vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
         ::begin(&this->materials);
    __gnu_cxx::
    __normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
    ::__normal_iterator<Assimp::ColladaExporter::Material*>
              ((__normal_iterator<Assimp::ColladaExporter::Material_const*,std::vector<Assimp::ColladaExporter::Material,std::allocator<Assimp::ColladaExporter::Material>>>
                *)&local_a60,&local_a68);
    while( true ) {
      mat_3 = (Material *)
              std::
              vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
              ::end(&this->materials);
      bVar3 = __gnu_cxx::operator!=
                        (&local_a60,
                         (__normal_iterator<Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                          *)&mat_3);
      if (!bVar3) break;
      local_a78 = __gnu_cxx::
                  __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
                  ::operator*(&local_a60);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"<material id=\"");
      XMLIDEncode(&local_a98,&local_a78->name);
      poVar8 = std::operator<<(poVar8,(string *)&local_a98);
      poVar8 = std::operator<<(poVar8,"\" name=\"");
      XMLEscape(&local_ab8,&local_a78->name);
      poVar8 = std::operator<<(poVar8,(string *)&local_ab8);
      poVar8 = std::operator<<(poVar8,"\">");
      std::operator<<(poVar8,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_ab8);
      std::__cxx11::string::~string((string *)&local_a98);
      PushTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"<instance_effect url=\"#");
      XMLIDEncode(&local_ad8,&local_a78->name);
      poVar8 = std::operator<<(poVar8,(string *)&local_ad8);
      poVar8 = std::operator<<(poVar8,"-fx\"/>");
      std::operator<<(poVar8,(string *)&this->endstr);
      std::__cxx11::string::~string((string *)&local_ad8);
      PopTag(this);
      poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
      poVar8 = std::operator<<(poVar8,"</material>");
      std::operator<<(poVar8,(string *)&this->endstr);
      __gnu_cxx::
      __normal_iterator<const_Assimp::ColladaExporter::Material_*,_std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>_>
      ::operator++(&local_a60);
    }
    PopTag(this);
    poVar8 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
    poVar8 = std::operator<<(poVar8,"</library_materials>");
    std::operator<<(poVar8,(string *)&this->endstr);
  }
  return;
}

Assistant:

void ColladaExporter::WriteMaterials()
{
  materials.resize( mScene->mNumMaterials);

  /// collect all materials from the scene
  size_t numTextures = 0;
  for( size_t a = 0; a < mScene->mNumMaterials; ++a )
  {
    const aiMaterial* mat = mScene->mMaterials[a];

    aiString name;
    if( mat->Get( AI_MATKEY_NAME, name) != aiReturn_SUCCESS ) {
      name = "mat";
      materials[a].name = std::string( "m") + to_string(a) + name.C_Str();
    } else {
      // try to use the material's name if no other material has already taken it, else append #
      std::string testName = name.C_Str();
      size_t materialCountWithThisName = 0;
      for( size_t i = 0; i < a; i ++ ) {
        if( materials[i].name == testName ) {
          materialCountWithThisName ++;
        }
      }
      if( materialCountWithThisName == 0 ) {
        materials[a].name = name.C_Str();
      } else {
        materials[a].name = std::string(name.C_Str()) + to_string(materialCountWithThisName);
      }
    }

    aiShadingMode shading = aiShadingMode_Flat;
    materials[a].shading_model = "phong";
    if(mat->Get( AI_MATKEY_SHADING_MODEL, shading) == aiReturn_SUCCESS) {
        if(shading == aiShadingMode_Phong) {
            materials[a].shading_model = "phong";
        } else if(shading == aiShadingMode_Blinn) {
            materials[a].shading_model = "blinn";
        } else if(shading == aiShadingMode_NoShading) {
            materials[a].shading_model = "constant";
        } else if(shading == aiShadingMode_Gouraud) {
            materials[a].shading_model = "lambert";
        }
    }

    ReadMaterialSurface( materials[a].ambient, mat, aiTextureType_AMBIENT, AI_MATKEY_COLOR_AMBIENT);
    if( !materials[a].ambient.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].diffuse, mat, aiTextureType_DIFFUSE, AI_MATKEY_COLOR_DIFFUSE);
    if( !materials[a].diffuse.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].specular, mat, aiTextureType_SPECULAR, AI_MATKEY_COLOR_SPECULAR);
    if( !materials[a].specular.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].emissive, mat, aiTextureType_EMISSIVE, AI_MATKEY_COLOR_EMISSIVE);
    if( !materials[a].emissive.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].reflective, mat, aiTextureType_REFLECTION, AI_MATKEY_COLOR_REFLECTIVE);
    if( !materials[a].reflective.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].transparent, mat, aiTextureType_OPACITY, AI_MATKEY_COLOR_TRANSPARENT);
    if( !materials[a].transparent.texture.empty() ) numTextures++;
    ReadMaterialSurface( materials[a].normal, mat, aiTextureType_NORMALS, NULL, 0, 0);
    if( !materials[a].normal.texture.empty() ) numTextures++;

    materials[a].shininess.exist = mat->Get( AI_MATKEY_SHININESS, materials[a].shininess.value) == aiReturn_SUCCESS;
    materials[a].transparency.exist = mat->Get( AI_MATKEY_OPACITY, materials[a].transparency.value) == aiReturn_SUCCESS;
    materials[a].index_refraction.exist = mat->Get( AI_MATKEY_REFRACTI, materials[a].index_refraction.value) == aiReturn_SUCCESS;
  }

  // output textures if present
  if( numTextures > 0 )
  {
    mOutput << startstr << "<library_images>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      WriteImageEntry( mat.ambient, mat.name + "-ambient-image");
      WriteImageEntry( mat.diffuse, mat.name + "-diffuse-image");
      WriteImageEntry( mat.specular, mat.name + "-specular-image");
      WriteImageEntry( mat.emissive, mat.name + "-emission-image");
      WriteImageEntry( mat.reflective, mat.name + "-reflective-image");
      WriteImageEntry( mat.transparent, mat.name + "-transparent-image");
      WriteImageEntry( mat.normal, mat.name + "-normal-image");
    }
    PopTag();
    mOutput << startstr << "</library_images>" << endstr;
  }

  // output effects - those are the actual carriers of information
  if( !materials.empty() )
  {
    mOutput << startstr << "<library_effects>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      // this is so ridiculous it must be right
      mOutput << startstr << "<effect id=\"" << XMLIDEncode(mat.name) << "-fx\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<profile_COMMON>" << endstr;
      PushTag();

      // write sampler- and surface params for the texture entries
      WriteTextureParamEntry( mat.emissive, "emission", mat.name);
      WriteTextureParamEntry( mat.ambient, "ambient", mat.name);
      WriteTextureParamEntry( mat.diffuse, "diffuse", mat.name);
      WriteTextureParamEntry( mat.specular, "specular", mat.name);
      WriteTextureParamEntry( mat.reflective, "reflective", mat.name);
      WriteTextureParamEntry( mat.transparent, "transparent", mat.name);
      WriteTextureParamEntry( mat.normal, "normal", mat.name);

      mOutput << startstr << "<technique sid=\"standard\">" << endstr;
      PushTag();
      mOutput << startstr << "<" << mat.shading_model << ">" << endstr;
      PushTag();

      WriteTextureColorEntry( mat.emissive, "emission", mat.name + "-emission-sampler");
      WriteTextureColorEntry( mat.ambient, "ambient", mat.name + "-ambient-sampler");
      WriteTextureColorEntry( mat.diffuse, "diffuse", mat.name + "-diffuse-sampler");
      WriteTextureColorEntry( mat.specular, "specular", mat.name + "-specular-sampler");
      WriteFloatEntry(mat.shininess, "shininess");
      WriteTextureColorEntry( mat.reflective, "reflective", mat.name + "-reflective-sampler");
      WriteTextureColorEntry( mat.transparent, "transparent", mat.name + "-transparent-sampler");
      WriteFloatEntry(mat.transparency, "transparency");
      WriteFloatEntry(mat.index_refraction, "index_of_refraction");

      if(! mat.normal.texture.empty()) {
        WriteTextureColorEntry( mat.normal, "bump", mat.name + "-normal-sampler");
      }

      PopTag();
      mOutput << startstr << "</" << mat.shading_model << ">" << endstr;
      PopTag();
      mOutput << startstr << "</technique>" << endstr;
      PopTag();
      mOutput << startstr << "</profile_COMMON>" << endstr;
      PopTag();
      mOutput << startstr << "</effect>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_effects>" << endstr;

    // write materials - they're just effect references
    mOutput << startstr << "<library_materials>" << endstr;
    PushTag();
    for( std::vector<Material>::const_iterator it = materials.begin(); it != materials.end(); ++it )
    {
      const Material& mat = *it;
      mOutput << startstr << "<material id=\"" << XMLIDEncode(mat.name) << "\" name=\"" << XMLEscape(mat.name) << "\">" << endstr;
      PushTag();
      mOutput << startstr << "<instance_effect url=\"#" << XMLIDEncode(mat.name) << "-fx\"/>" << endstr;
      PopTag();
      mOutput << startstr << "</material>" << endstr;
    }
    PopTag();
    mOutput << startstr << "</library_materials>" << endstr;
  }
}